

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_binary(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *__needle;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX;
  void *pvVar12;
  undefined8 extraout_RAX_00;
  undefined1 *__n;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined8 extraout_RAX_01;
  void *__s2;
  undefined1 *puVar15;
  undefined8 extraout_RAX_02;
  int *__haystack;
  undefined8 extraout_RAX_03;
  long *plVar16;
  undefined8 extraout_RAX_04;
  undefined8 uVar17;
  undefined8 uVar18;
  char *unaff_RBX;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  char *unaff_R12;
  undefined **ppuVar22;
  char *pcVar23;
  undefined **ppuVar24;
  long lVar25;
  undefined **ppuVar26;
  int *piVar27;
  int *unaff_R15;
  int *piVar28;
  double dVar29;
  int extraout_XMM0_Db;
  uint32_t len;
  uint8_t *binary;
  bson_subtype_t subtype;
  bson_t b;
  bson_error_t error;
  code **ppcVar30;
  undefined4 uStack_57dc;
  undefined8 uStack_57d8;
  undefined2 uStack_57d0;
  int iStack_57c8;
  int iStack_57c4;
  char acStack_57c0 [504];
  code *pcStack_55c8;
  undefined1 auStack_55b8 [512];
  char *pcStack_53b8;
  code *pcStack_53b0;
  int iStack_53a0;
  int iStack_539c;
  char acStack_5398 [504];
  long *plStack_51a0;
  char *pcStack_5198;
  char *pcStack_5190;
  undefined **ppuStack_5188;
  long lStack_5110;
  long lStack_5108;
  undefined1 auStack_5100 [128];
  undefined1 auStack_5080 [232];
  undefined1 auStack_4f98 [608];
  long *plStack_4d38;
  code *pcStack_4d30;
  undefined1 auStack_4d28 [8];
  char acStack_4d20 [16];
  char *pcStack_4d10;
  code *pcStack_4d08;
  uint uStack_4c84;
  undefined8 uStack_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 uStack_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 uStack_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 uStack_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined1 auStack_4bb8 [648];
  int *piStack_4930;
  char *pcStack_4928;
  undefined **ppuStack_4920;
  undefined1 *puStack_4918;
  undefined **ppuStack_4910;
  code *pcStack_4908;
  undefined1 auStack_4900 [240];
  undefined1 auStack_4810 [648];
  code *apcStack_4588 [16];
  undefined *puStack_4508;
  undefined1 auStack_4500 [200];
  int iStack_4438;
  int iStack_4434;
  int aiStack_4430 [160];
  int *piStack_41b0;
  double *pdStack_41a8;
  undefined **ppuStack_41a0;
  int *piStack_4198;
  int *piStack_4190;
  code *apcStack_4188 [16];
  double dStack_4108;
  int aiStack_4100 [50];
  int iStack_4038;
  int iStack_4034;
  int aiStack_4030 [160];
  undefined8 uStack_3db0;
  undefined1 *puStack_3da8;
  char *pcStack_3da0;
  char *pcStack_3d98;
  undefined **ppuStack_3d90;
  code *pcStack_3d88;
  int iStack_3d80;
  int iStack_3d7c;
  char acStack_3d78 [504];
  undefined1 auStack_3b80 [336];
  char *pcStack_3a30;
  undefined1 *puStack_3a28;
  undefined1 *puStack_3a20;
  void *pvStack_3a18;
  void *pvStack_3a10;
  code *pcStack_3a08;
  undefined1 auStack_3a00 [128];
  char acStack_3980 [232];
  undefined1 auStack_3898 [648];
  char *pcStack_3610;
  code *pcStack_3608;
  undefined1 auStack_3600 [128];
  char acStack_3580 [224];
  int iStack_34a0;
  int iStack_349c;
  char acStack_3498 [640];
  char *pcStack_3218;
  void *pvStack_3210;
  code *pcStack_3208;
  undefined1 auStack_3200 [128];
  char acStack_3180 [232];
  undefined1 auStack_3098 [648];
  char *pcStack_2e10;
  code *pcStack_2e08;
  undefined1 auStack_2e00 [232];
  int iStack_2d18;
  int iStack_2d14;
  char acStack_2d10 [640];
  char *pcStack_2a90;
  code *apcStack_2a88 [16];
  uint uStack_2a04;
  undefined1 auStack_2a00 [4];
  uint uStack_29fc;
  undefined1 auStack_2938 [648];
  undefined1 *puStack_26b0;
  undefined1 *puStack_26a8;
  undefined1 *puStack_26a0;
  void *pvStack_2698;
  void *pvStack_2690;
  code *pcStack_2688;
  uint uStack_267c;
  void *pvStack_2678;
  char *pcStack_2670;
  void *pvStack_2668;
  char *pcStack_2660;
  void *pvStack_2658;
  char *pcStack_2650;
  undefined1 *puStack_2648;
  char *pcStack_2640;
  undefined1 *puStack_2638;
  char *pcStack_2630;
  undefined8 uStack_2628;
  char *pcStack_2620;
  undefined8 uStack_2618;
  char *pcStack_2610;
  undefined8 uStack_2608;
  undefined1 auStack_2600 [4];
  uint uStack_25fc;
  undefined1 auStack_2538 [592];
  undefined8 uStack_22e8;
  char *pcStack_22e0;
  char *pcStack_22d8;
  char *pcStack_22d0;
  char *pcStack_22c8;
  char *pcStack_22c0;
  char *pcStack_22b8;
  char *pcStack_22b0;
  char *pcStack_22a8;
  char *pcStack_22a0;
  char *pcStack_2298;
  char *pcStack_2290;
  code *apcStack_2288 [7];
  undefined8 uStack_2250;
  void *pvStack_2248;
  char *pcStack_2240;
  void *pvStack_2238;
  char *pcStack_2230;
  undefined8 uStack_2228;
  char *pcStack_2220;
  void *pvStack_2218;
  char *pcStack_2210;
  undefined8 uStack_2208;
  char acStack_2200 [4];
  uint uStack_21fc;
  undefined1 auStack_2138 [648];
  undefined **ppuStack_1eb0;
  char *pcStack_1ea8;
  long lStack_1ea0;
  undefined1 *puStack_1e98;
  undefined1 *puStack_1e90;
  code *pcStack_1e88;
  int iStack_1e80;
  int iStack_1e7c;
  char acStack_1e78 [504];
  undefined1 auStack_1c80 [168];
  undefined8 uStack_1bd8;
  long lStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 uStack_1bc0;
  char *pcStack_1bb8;
  char *pcStack_1bb0;
  char *pcStack_1ba8;
  char *pcStack_1ba0;
  char *pcStack_1b98;
  long lStack_1b90;
  undefined8 uStack_1b88;
  char *pcStack_1b80;
  char *pcStack_1b78;
  char *pcStack_1b70;
  char *pcStack_1b68;
  long lStack_1b60;
  char *pcStack_1b58;
  char *pcStack_1b50;
  char *pcStack_1b48;
  char *pcStack_1b40;
  char *pcStack_1b38;
  char *pcStack_1b30;
  char *pcStack_1b28;
  char *pcStack_1b20;
  char *pcStack_1b18;
  char *pcStack_1b10;
  code *apcStack_1b08 [12];
  undefined8 uStack_1aa8;
  char *pcStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 uStack_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 uStack_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 uStack_1a40;
  undefined8 uStack_1a38;
  char *apcStack_1a30 [22];
  char acStack_1980 [4];
  uint uStack_197c;
  undefined1 auStack_18b8 [648];
  char *pcStack_1630;
  undefined **ppuStack_1628;
  int **ppiStack_1620;
  char *pcStack_1618;
  int *piStack_1610;
  code *pcStack_1608;
  undefined1 auStack_1600 [128];
  undefined1 auStack_1580 [240];
  undefined1 auStack_1490 [648];
  code *pcStack_1208;
  undefined1 auStack_1200 [128];
  char acStack_1180 [232];
  int iStack_1098;
  int iStack_1094;
  char acStack_1090 [632];
  char *pcStack_e18;
  code *apcStack_e10 [2];
  int iStack_e00;
  int iStack_dfc;
  undefined8 uStack_c28;
  char *pcStack_c20;
  undefined8 uStack_c18;
  int *piStack_c10;
  code *pcStack_c08;
  int iStack_b84;
  int aiStack_b80 [46];
  undefined8 uStack_ac8;
  int *piStack_ac0;
  char acStack_ab4 [12];
  undefined1 auStack_aa8 [648];
  char *pcStack_820;
  char *pcStack_818;
  int *piStack_810;
  code *apcStack_808 [15];
  int iStack_790;
  int iStack_78c;
  int *piStack_788;
  char acStack_780 [200];
  undefined1 auStack_6b8 [648];
  char *pcStack_430;
  char *pcStack_428;
  code *apcStack_408 [14];
  int local_394;
  char *local_390;
  int local_384;
  char local_380 [208];
  int local_2b0;
  int local_2ac;
  char local_2a8 [640];
  
  apcStack_408[0] = (code *)0x131282;
  cVar1 = bson_init_from_json(local_380,
                              "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
                              0xffffffffffffffff,&local_2b0);
  if (cVar1 == '\0') {
LAB_0013148e:
    apcStack_408[0] = (code *)0x13149b;
    test_bson_json_read_binary_cold_1();
LAB_0013149b:
    apcStack_408[0] = (code *)0x1314a0;
    test_bson_json_read_binary_cold_2();
LAB_001314a0:
    apcStack_408[0] = (code *)0x1314a5;
    test_bson_json_read_binary_cold_3();
LAB_001314a5:
    apcStack_408[0] = (code *)0x1314b2;
    test_bson_json_read_binary_cold_5();
LAB_001314b2:
    apcStack_408[0] = (code *)0x1314b7;
    test_bson_json_read_binary_cold_6();
LAB_001314b7:
    apcStack_408[0] = (code *)0x1314bc;
    test_bson_json_read_binary_cold_7();
LAB_001314bc:
    apcStack_408[0] = (code *)0x1314c1;
    test_bson_json_read_binary_cold_9();
LAB_001314c1:
    apcStack_408[0] = (code *)0x1314c6;
    test_bson_json_read_binary_cold_10();
LAB_001314c6:
    apcStack_408[0] = (code *)0x1314ce;
    test_bson_json_read_binary_cold_15();
LAB_001314ce:
    apcStack_408[0] = (code *)0x1314d3;
    test_bson_json_read_binary_cold_11();
LAB_001314d3:
    apcStack_408[0] = (code *)0x1314d8;
    test_bson_json_read_binary_cold_12();
LAB_001314d8:
    apcStack_408[0] = (code *)0x1314e0;
    test_bson_json_read_binary_cold_13();
LAB_001314e0:
    apcStack_408[0] = (code *)0x1314e8;
    test_bson_json_read_binary_cold_4();
  }
  else {
    apcStack_408[0] = (code *)0x13128f;
    unaff_RBX = (char *)bson_bcone_magic();
    unaff_R15 = &local_394;
    apcStack_408[0] = (code *)0x0;
    bcon_extract(local_380,"b",unaff_RBX,4,&local_384,&local_390);
    if (local_384 != 5) goto LAB_0013149b;
    if (local_394 != 3) goto LAB_001314a0;
    unaff_R12 = "foo";
    if (local_390 != "foo") {
      apcStack_408[0] = (code *)0x131303;
      iVar2 = strcmp(local_390,"foo");
      if (iVar2 == 0) goto LAB_0013130b;
      goto LAB_001314e0;
    }
LAB_0013130b:
    apcStack_408[0] = (code *)0x13131b;
    bson_destroy(local_380);
    apcStack_408[0] = (code *)0x131339;
    cVar1 = bson_init_from_json(local_380,
                                "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                ,0xffffffffffffffff,&local_2b0);
    if (cVar1 == '\0') goto LAB_001314a5;
    apcStack_408[0] = (code *)0x0;
    bcon_extract(local_380,"b",unaff_RBX,4,&local_384,&local_390);
    if (local_384 != 5) goto LAB_001314b2;
    if (local_394 != 3) goto LAB_001314b7;
    if (local_390 == "foo") {
LAB_001313ae:
      unaff_RBX = local_380;
      apcStack_408[0] = (code *)0x1313be;
      bson_destroy(unaff_RBX);
      apcStack_408[0] = (code *)0x1313dc;
      cVar1 = bson_init_from_json(unaff_RBX,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                  0xffffffffffffffff,&local_2b0);
      if (cVar1 != '\0') {
        apcStack_408[0] = (code *)0x131489;
        test_bson_json_read_binary_cold_16();
LAB_00131489:
        apcStack_408[0] = (code *)0x13148e;
        test_bson_json_read_binary_cold_14();
        goto LAB_0013148e;
      }
      if (local_2b0 != 1) goto LAB_001314bc;
      if (local_2ac != 2) goto LAB_001314c1;
      unaff_RBX = local_2a8;
      apcStack_408[0] = (code *)0x13141b;
      pcVar5 = strstr(unaff_RBX,"Missing \"base64\" after \"subType\"");
      if (pcVar5 == (char *)0x0) goto LAB_001314c6;
      apcStack_408[0] = (code *)0x131447;
      cVar1 = bson_init_from_json(local_380,"{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                  0xffffffffffffffff,&local_2b0);
      if (cVar1 != '\0') goto LAB_00131489;
      if (local_2b0 != 1) goto LAB_001314ce;
      if (local_2ac != 2) goto LAB_001314d3;
      apcStack_408[0] = (code *)0x131472;
      pcVar5 = strstr(unaff_RBX,"Missing \"subType\" after \"base64\"");
      if (pcVar5 != (char *)0x0) {
        return;
      }
      goto LAB_001314d8;
    }
    apcStack_408[0] = (code *)0x1313a6;
    iVar2 = strcmp(local_390,"foo");
    unaff_RBX = local_390;
    if (iVar2 == 0) goto LAB_001313ae;
  }
  apcStack_408[0] = test_bson_json_read_legacy_binary;
  test_bson_json_read_binary_cold_8();
  pcVar19 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  ppuVar22 = &PTR_anon_var_dwarf_1a702_00163258;
  pcVar5 = "foo";
  pcStack_430 = unaff_RBX;
  pcStack_428 = unaff_R12;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  while( true ) {
    apcStack_808[0] = (code *)0x131541;
    cVar1 = bson_init_from_json(acStack_780,pcVar19,0xffffffffffffffff,auStack_6b8);
    if (cVar1 == '\0') break;
    apcStack_808[0] = (code *)0x13154e;
    uVar6 = bson_bcone_magic();
    apcStack_808[0] = (code *)0x0;
    piStack_810 = &iStack_790;
    pcStack_818 = (char *)0x131578;
    bcon_extract(acStack_780,"x",uVar6,4,&iStack_78c,&piStack_788);
    if (iStack_78c != 5) {
LAB_001315d4:
      apcStack_808[0] = (code *)0x1315d9;
      test_bson_json_read_legacy_binary_cold_2();
      break;
    }
    if (iStack_790 != 3) {
      apcStack_808[0] = (code *)0x1315d4;
      test_bson_json_read_legacy_binary_cold_3();
      goto LAB_001315d4;
    }
    unaff_R15 = piStack_788;
    if (piStack_788 != (int *)"foo") {
      apcStack_808[0] = (code *)0x1315a3;
      iVar2 = strcmp((char *)piStack_788,"foo");
      if (iVar2 == 0) goto LAB_001315a7;
      goto LAB_001315e6;
    }
LAB_001315a7:
    apcStack_808[0] = (code *)0x1315af;
    bson_destroy(acStack_780);
    pcVar19 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
  apcStack_808[0] = (code *)0x1315e6;
  test_bson_json_read_legacy_binary_cold_1();
LAB_001315e6:
  apcStack_808[0] = test_json_reader_new_from_file;
  test_bson_json_read_legacy_binary_cold_4();
  pcStack_818 = "foo";
  aiStack_b80[0x1c] = 0;
  aiStack_b80[0x1d] = 0;
  aiStack_b80[0x1e] = 0;
  aiStack_b80[0x1f] = 0;
  aiStack_b80[0x18] = 0;
  aiStack_b80[0x19] = 0;
  aiStack_b80[0x1a] = 0;
  aiStack_b80[0x1b] = 0;
  aiStack_b80[0x14] = 0;
  aiStack_b80[0x15] = 0;
  aiStack_b80[0x16] = 0;
  aiStack_b80[0x17] = 0;
  aiStack_b80[0x10] = 0;
  aiStack_b80[0x11] = 0;
  aiStack_b80[0x12] = 0;
  aiStack_b80[0x13] = 0;
  aiStack_b80[0xc] = 0;
  aiStack_b80[0xd] = 0;
  aiStack_b80[0xe] = 0;
  aiStack_b80[0xf] = 0;
  aiStack_b80[8] = 0;
  aiStack_b80[9] = 0;
  aiStack_b80[10] = 0;
  aiStack_b80[0xb] = 0;
  aiStack_b80[4] = 0;
  aiStack_b80[5] = 0;
  aiStack_b80[6] = 0;
  aiStack_b80[7] = 0;
  aiStack_b80[0] = 3;
  aiStack_b80[1] = 5;
  aiStack_b80[2] = 5;
  aiStack_b80[3] = 0;
  pcStack_c08 = (code *)0x131673;
  pcStack_820 = acStack_780;
  piStack_810 = unaff_R15;
  apcStack_808[0] = (code *)apcStack_408;
  pcVar19 = (char *)bson_json_reader_new_from_file
                              ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                               ,auStack_aa8);
  if (pcVar19 == (char *)0x0) {
    pcStack_c08 = (code *)0x1317bc;
    test_json_reader_new_from_file_cold_6();
    pcVar19 = acStack_780;
LAB_001317bc:
    pcStack_c08 = (code *)0x1317c1;
    test_json_reader_new_from_file_cold_5();
LAB_001317c1:
    pcStack_c08 = (code *)0x1317d9;
    test_json_reader_new_from_file_cold_1();
LAB_001317d9:
    pcStack_c08 = (code *)0x1317de;
    test_json_reader_new_from_file_cold_3();
LAB_001317de:
    pcStack_c08 = (code *)0x1317f6;
    test_json_reader_new_from_file_cold_4();
  }
  else {
    pcStack_c08 = (code *)0x131697;
    iVar2 = bson_json_reader_read(pcVar19,aiStack_b80,auStack_aa8);
    if (iVar2 != 1) goto LAB_001317c1;
    pcStack_c08 = (code *)0x1316a5;
    pcVar5 = (char *)bson_bcone_magic();
    piStack_c10 = &iStack_b84;
    pcStack_c08 = (code *)0x0;
    uStack_c18 = 0xf;
    uStack_c28 = 0x1316e2;
    pcStack_c20 = pcVar5;
    bcon_extract(aiStack_b80,"foo",pcVar5,0,&piStack_ac0,"a");
    unaff_R15 = piStack_ac0;
    if (piStack_ac0 == (int *)0x1428c0) {
LAB_0013170c:
      if (iStack_b84 != 1) goto LAB_001317d9;
      unaff_R15 = aiStack_b80;
      pcStack_c08 = (code *)0x131729;
      bson_reinit(unaff_R15);
      pcStack_c08 = (code *)0x13173c;
      iVar2 = bson_json_reader_read(pcVar19,unaff_R15,auStack_aa8);
      if (iVar2 == 1) {
        unaff_R15 = (int *)&uStack_ac8;
        pcStack_c08 = (code *)0x131771;
        bcon_extract(aiStack_b80,"_id",pcVar5,6,unaff_R15,0);
        pcVar5 = acStack_ab4;
        pcStack_c08 = (code *)0x131788;
        bson_oid_init_from_string(pcVar5,"aabbccddeeff001122334455");
        pcStack_c08 = (code *)0x131793;
        cVar1 = bson_oid_equal(pcVar5,uStack_ac8);
        if (cVar1 != '\0') {
          pcStack_c08 = (code *)0x1317a4;
          bson_destroy(aiStack_b80);
          pcStack_c08 = (code *)0x1317ac;
          bson_json_reader_destroy(pcVar19);
          return;
        }
        goto LAB_001317bc;
      }
      goto LAB_001317de;
    }
    pcStack_c08 = (code *)0x131704;
    iVar2 = strcmp("bar",(char *)piStack_ac0);
    if (iVar2 == 0) goto LAB_0013170c;
  }
  pcStack_c08 = test_json_reader_new_from_bad_path;
  test_json_reader_new_from_file_cold_2();
  apcStack_e10[0] = (code *)0x131816;
  lVar7 = bson_json_reader_new_from_file
                    ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                     ,&iStack_e00);
  if (lVar7 == 0) {
    if (iStack_e00 != 2) goto LAB_0013183a;
    if (iStack_dfc == 1) {
      return;
    }
  }
  else {
    apcStack_e10[0] = (code *)0x13183a;
    test_json_reader_new_from_bad_path_cold_1();
LAB_0013183a:
    apcStack_e10[0] = (code *)0x13183f;
    test_json_reader_new_from_bad_path_cold_2();
  }
  apcStack_e10[0] = test_bson_json_number_long;
  test_json_reader_new_from_bad_path_cold_3();
  pcStack_1208 = (code *)0x131877;
  pcStack_e18 = pcVar19;
  apcStack_e10[0] = (code *)apcStack_808;
  cVar1 = bson_init_from_json(acStack_1180,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}",
                              0xffffffffffffffff,&iStack_1098);
  if (cVar1 == '\0') {
LAB_00131c0c:
    pcStack_1208 = (code *)0x131c19;
    test_bson_json_number_long_cold_1();
LAB_00131c19:
    pcStack_1208 = (code *)0x131c26;
    test_bson_json_number_long_cold_6();
LAB_00131c26:
    pcStack_1208 = (code *)0x131c2e;
    test_bson_json_number_long_cold_9();
LAB_00131c2e:
    pcStack_1208 = (code *)0x131c3b;
    test_bson_json_number_long_cold_10();
LAB_00131c3b:
    pcStack_1208 = (code *)0x131c43;
    test_bson_json_number_long_cold_13();
LAB_00131c43:
    pcStack_1208 = (code *)0x131c48;
    test_bson_json_number_long_cold_14();
LAB_00131c48:
    pcStack_1208 = (code *)0x131c4d;
    test_bson_json_number_long_cold_15();
LAB_00131c4d:
    pcStack_1208 = (code *)0x131c55;
    test_bson_json_number_long_cold_28();
LAB_00131c55:
    pcStack_1208 = (code *)0x131c5a;
    test_bson_json_number_long_cold_16();
LAB_00131c5a:
    pcStack_1208 = (code *)0x131c5f;
    test_bson_json_number_long_cold_17();
LAB_00131c5f:
    pcStack_1208 = (code *)0x131c67;
    test_bson_json_number_long_cold_26();
LAB_00131c67:
    pcStack_1208 = (code *)0x131c6c;
    test_bson_json_number_long_cold_18();
LAB_00131c6c:
    pcStack_1208 = (code *)0x131c71;
    test_bson_json_number_long_cold_19();
LAB_00131c71:
    pcStack_1208 = (code *)0x131c79;
    test_bson_json_number_long_cold_24();
LAB_00131c79:
    pcStack_1208 = (code *)0x131c7e;
    test_bson_json_number_long_cold_20();
LAB_00131c7e:
    pcStack_1208 = (code *)0x131c83;
    test_bson_json_number_long_cold_21();
  }
  else {
    pcStack_1208 = (code *)0x13188f;
    cVar1 = bson_iter_init(auStack_1200,acStack_1180);
    if (cVar1 == '\0') {
      pcStack_1208 = (code *)0x131bcb;
      test_bson_json_number_long_cold_2();
LAB_00131bcb:
      pcStack_1208 = (code *)0x131bd0;
      test_bson_json_number_long_cold_3();
LAB_00131bd0:
      pcStack_1208 = (code *)0x131bd5;
      test_bson_json_number_long_cold_4();
LAB_00131bd5:
      pcStack_1208 = (code *)0x131bda;
      test_bson_json_number_long_cold_5();
LAB_00131bda:
      pcStack_1208 = (code *)0x131bdf;
      test_bson_json_number_long_cold_31();
LAB_00131bdf:
      pcStack_1208 = (code *)0x131be4;
      test_bson_json_number_long_cold_30();
LAB_00131be4:
      pcStack_1208 = (code *)0x131be9;
      test_bson_json_number_long_cold_7();
LAB_00131be9:
      pcStack_1208 = (code *)0x131bee;
      test_bson_json_number_long_cold_8();
LAB_00131bee:
      pcStack_1208 = (code *)0x131bf3;
      test_bson_json_number_long_cold_11();
LAB_00131bf3:
      pcStack_1208 = (code *)0x131bf8;
      test_bson_json_number_long_cold_12();
LAB_00131bf8:
      pcStack_1208 = (code *)0x131bfd;
      test_bson_json_number_long_cold_29();
LAB_00131bfd:
      pcStack_1208 = (code *)0x131c02;
      test_bson_json_number_long_cold_27();
LAB_00131c02:
      pcStack_1208 = (code *)0x131c07;
      test_bson_json_number_long_cold_25();
LAB_00131c07:
      pcStack_1208 = (code *)0x131c0c;
      test_bson_json_number_long_cold_23();
      goto LAB_00131c0c;
    }
    pcStack_1208 = (code *)0x1318a6;
    cVar1 = bson_iter_find(auStack_1200,"key");
    if (cVar1 == '\0') goto LAB_00131bcb;
    pcStack_1208 = (code *)0x1318b6;
    iVar2 = bson_iter_type(auStack_1200);
    if (iVar2 != 0x12) goto LAB_00131bd0;
    pcStack_1208 = (code *)0x1318c7;
    lVar7 = bson_iter_int64(auStack_1200);
    if (lVar7 != 0x4000000000000000) goto LAB_00131bd5;
    pcVar19 = acStack_1180;
    pcStack_1208 = (code *)0x1318ea;
    bson_destroy(pcVar19);
    pcStack_1208 = (code *)0x131908;
    cVar1 = bson_init_from_json(pcVar19,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 != '\0') goto LAB_00131bda;
    pcStack_1208 = (code *)0x131933;
    cVar1 = bson_init_from_json(acStack_1180,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 != '\0') goto LAB_00131bdf;
    pcStack_1208 = (code *)0x13195e;
    cVar1 = bson_init_from_json(acStack_1180,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 == '\0') goto LAB_00131c19;
    pcStack_1208 = (code *)0x13197d;
    cVar1 = bson_iter_init_find(auStack_1200,acStack_1180,"x");
    if (cVar1 == '\0') goto LAB_00131be4;
    pcStack_1208 = (code *)0x13198d;
    iVar2 = bson_iter_type(auStack_1200);
    if (iVar2 != 0x12) goto LAB_00131be9;
    pcVar19 = (char *)0x7fffffffffffffff;
    pcStack_1208 = (code *)0x1319a8;
    lVar7 = bson_iter_int64(auStack_1200);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00131c26;
    pcStack_1208 = (code *)0x1319d4;
    cVar1 = bson_init_from_json(acStack_1180,"{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 == '\0') goto LAB_00131c2e;
    pcStack_1208 = (code *)0x1319f3;
    cVar1 = bson_iter_init_find(auStack_1200,acStack_1180,"x");
    if (cVar1 == '\0') goto LAB_00131bee;
    pcStack_1208 = (code *)0x131a03;
    iVar2 = bson_iter_type(auStack_1200);
    if (iVar2 != 0x12) goto LAB_00131bf3;
    pcStack_1208 = (code *)0x131a14;
    lVar7 = bson_iter_int64(auStack_1200);
    pcVar19 = (char *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_00131c3b;
    pcVar19 = acStack_1180;
    pcStack_1208 = (code *)0x131a30;
    bson_destroy(pcVar19);
    pcStack_1208 = (code *)0x131a4e;
    cVar1 = bson_init_from_json(pcVar19,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 != '\0') goto LAB_00131bf8;
    if (iStack_1098 != 1) goto LAB_00131c43;
    if (iStack_1094 != 2) goto LAB_00131c48;
    pcVar19 = acStack_1090;
    pcStack_1208 = (code *)0x131a8d;
    pcVar8 = strstr(pcVar19,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00131c4d;
    pcStack_1208 = (code *)0x131ab9;
    cVar1 = bson_init_from_json(acStack_1180,"{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 != '\0') goto LAB_00131bfd;
    if (iStack_1098 != 1) goto LAB_00131c55;
    if (iStack_1094 != 2) goto LAB_00131c5a;
    pcStack_1208 = (code *)0x131af0;
    pcVar8 = strstr(pcVar19,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00131c5f;
    pcStack_1208 = (code *)0x131b1c;
    cVar1 = bson_init_from_json(acStack_1180,"{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                0xffffffffffffffff,&iStack_1098);
    if (cVar1 != '\0') goto LAB_00131c02;
    if (iStack_1098 != 1) goto LAB_00131c67;
    if (iStack_1094 != 2) goto LAB_00131c6c;
    pcStack_1208 = (code *)0x131b53;
    pcVar8 = strstr(pcVar19,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00131c71;
    pcStack_1208 = (code *)0x131b7f;
    cVar1 = bson_init_from_json(acStack_1180,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                &iStack_1098);
    if (cVar1 != '\0') goto LAB_00131c07;
    if (iStack_1098 != 1) goto LAB_00131c79;
    if (iStack_1094 != 2) goto LAB_00131c7e;
    pcStack_1208 = (code *)0x131bb6;
    pcVar8 = strstr(pcVar19,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_1208 = test_bson_json_number_long_zero;
  test_bson_json_number_long_cold_22();
  pcStack_1608 = (code *)0x131cbd;
  pcStack_1208 = (code *)apcStack_e10;
  cVar1 = bson_init_from_json(auStack_1580,"{ \"key\": { \"$numberLong\": \"0\" }}",
                              0xffffffffffffffff,auStack_1490);
  if (cVar1 != '\0') {
    pcStack_1608 = (code *)0x131cd1;
    cVar1 = bson_iter_init(auStack_1600,auStack_1580);
    if (cVar1 == '\0') {
      pcStack_1608 = (code *)0x131d19;
      test_bson_json_number_long_zero_cold_2();
LAB_00131d19:
      pcStack_1608 = (code *)0x131d1e;
      test_bson_json_number_long_zero_cold_3();
LAB_00131d1e:
      pcStack_1608 = (code *)0x131d23;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_1608 = (code *)0x131ce4;
      cVar1 = bson_iter_find(auStack_1600,"key");
      if (cVar1 == '\0') goto LAB_00131d19;
      pcStack_1608 = (code *)0x131cf0;
      iVar2 = bson_iter_type(auStack_1600);
      if (iVar2 != 0x12) goto LAB_00131d1e;
      pcStack_1608 = (code *)0x131cfd;
      lVar7 = bson_iter_int64(auStack_1600);
      if (lVar7 == 0) {
        pcStack_1608 = (code *)0x131d0f;
        bson_destroy(auStack_1580);
        return;
      }
    }
    pcStack_1608 = (code *)0x131d28;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_1608 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_1b08[0] = (code *)0x131d52;
  pcStack_1630 = pcVar19;
  ppuStack_1628 = ppuVar22;
  ppiStack_1620 = &piStack_788;
  pcStack_1618 = pcVar5;
  piStack_1610 = unaff_R15;
  pcStack_1608 = (code *)&pcStack_1208;
  lVar7 = bson_bcon_magic();
  apcStack_1b08[0] = (code *)0x131d7d;
  pcStack_1aa0 = (char *)bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_1b08[0] = (code *)0x131da0;
  uStack_1aa8 = bcon_new(0,"a",lVar7,0xc,"b",0);
  apcStack_1b08[0] = (code *)0x131dc6;
  uVar6 = bcon_new(0,"var",lVar7,0xf,1,0);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x131dec;
  uStack_1a38 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  apcStack_1b08[0] = (code *)0x131e19;
  uVar9 = bcon_new(0,"var2",lVar7,0x11,2,0);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x131e3f;
  uStack_1a40 = bcon_new(0,"a",lVar7,0xe,"b",uVar9);
  apcStack_1b08[0] = (code *)0x0;
  pcStack_1b18 = "d";
  pcStack_1b20 = (char *)0xe;
  pcStack_1b30 = "c";
  pcStack_1b38 = (char *)0x131e89;
  pcStack_1b28 = (char *)lVar7;
  pcStack_1b10 = (char *)uVar9;
  uStack_1a78 = uVar9;
  uStack_1a48 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = "}";
  pcStack_1b20 = "}";
  pcStack_1b28 = "value2";
  pcStack_1b30 = (char *)0x0;
  pcStack_1b40 = "key2";
  pcStack_1b48 = "{";
  pcStack_1b50 = "subdoc";
  pcStack_1b58 = "value";
  lStack_1b60 = 0;
  pcStack_1b70 = "key1";
  pcStack_1b78 = "{";
  pcStack_1b80 = "c";
  uStack_1b88 = 0x131f0d;
  pcStack_1b68 = (char *)lVar7;
  pcStack_1b38 = (char *)lVar7;
  uStack_1a50 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x131f51;
  uStack_1a70 = uVar6;
  uStack_1a58 = bcon_new(0,"a",lVar7,0xe,"b",uVar6);
  apcStack_1b08[0] = (code *)0x131f7a;
  uStack_1a80 = bcon_new(0,"var","{","}",0);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x131fa2;
  uStack_1a60 = bcon_new(0,"a",lVar7,0xe,"b",uStack_1a80);
  apcStack_1b08[0] = (code *)0x0;
  pcStack_1b10 = "}";
  pcStack_1b18 = "}";
  pcStack_1b20 = (char *)0x3;
  pcStack_1b28 = (char *)0xf;
  pcStack_1b38 = "z";
  pcStack_1b40 = "{";
  pcStack_1b48 = "d3";
  pcStack_1b50 = (char *)0x1;
  pcStack_1b58 = (char *)0xf;
  pcStack_1b68 = "x";
  pcStack_1b70 = "{";
  pcStack_1b78 = "d2";
  pcStack_1b80 = (char *)0x1;
  uStack_1b88 = 0x11;
  pcStack_1b98 = "n";
  pcStack_1ba0 = "}";
  pcStack_1ba8 = "{";
  pcStack_1bb0 = "d";
  pcStack_1bb8 = "]";
  uStack_1bc0 = 2;
  uStack_1bc8 = 0xf;
  uStack_1bd8 = 0x132050;
  lStack_1bd0 = lVar7;
  lStack_1b90 = lVar7;
  lStack_1b60 = lVar7;
  pcStack_1b30 = (char *)lVar7;
  uStack_1a88 = bcon_new(0,"arr","[",lVar7,0xf,1);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x13208c;
  uStack_1a68 = bcon_new(0,"a",lVar7,0xe,"b",uStack_1a88);
  apcStack_1b08[0] = (code *)0x13209d;
  uStack_1a90 = bson_new();
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x1320c5;
  pcVar19 = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_1a90);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = "}";
  pcStack_1b20 = "c";
  pcStack_1b28 = (char *)0x132108;
  uStack_1a98 = bcon_new(0,"x","{","$code",lVar7,0);
  pcStack_1b10 = (char *)0x0;
  pcStack_1b18 = (char *)0x13212d;
  apcStack_1a30[0x15] = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_1a98);
  apcStack_1a30[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_1a30[1] = pcStack_1aa0;
  apcStack_1a30[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_1a30[3] = (char *)uStack_1aa8;
  apcStack_1a30[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_1a30[5] = (char *)uStack_1a38;
  apcStack_1a30[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_1a30[7] = (char *)uStack_1a40;
  apcStack_1a30[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_1a30[9] = (char *)uStack_1a50;
  apcStack_1a30[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_1a30[0xb] = (char *)uStack_1a48;
  apcStack_1a30[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_1a30[0xd] = (char *)uStack_1a58;
  apcStack_1a30[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_1a30[0xf] = (char *)uStack_1a60;
  apcStack_1a30[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_1a30[0x11] = (char *)uStack_1a68;
  apcStack_1a30[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_1a30[0x13] = pcVar19;
  apcStack_1a30[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar23 = (char *)0x8;
  pcVar5 = acStack_1980;
  pcVar8 = "b";
  while( true ) {
    apcStack_1b08[0] = (code *)0x13229d;
    cVar1 = bson_init_from_json(pcVar5,*(undefined8 *)((long)&uStack_1a38 + (long)pcVar23),
                                0xffffffffffffffff,auStack_18b8);
    __needle = pcVar23;
    if (cVar1 == '\0') break;
    apcStack_1b08[0] = (code *)0x1322b0;
    pcStack_1aa0 = (char *)bson_get_data(pcVar5);
    lVar7 = *(long *)((long)apcStack_1a30 + (long)pcVar23);
    apcStack_1b08[0] = (code *)0x1322c5;
    __needle = (char *)bson_get_data(lVar7);
    if (*(uint *)(lVar7 + 4) != uStack_197c) {
LAB_00132392:
      pcVar5 = acStack_1980;
      apcStack_1b08[0] = (code *)0x1323a4;
      pcVar8 = (char *)bson_as_canonical_extended_json(pcVar5);
      apcStack_1b08[0] = (code *)0x1323b1;
      uVar6 = bson_as_canonical_extended_json(lVar7);
      pcVar19 = pcStack_1aa0;
      uVar3 = *(uint *)(lVar7 + 4);
      if (uStack_197c == 0) goto LAB_001323e2;
      uVar20 = 0;
      goto LAB_001323c8;
    }
    apcStack_1b08[0] = (code *)0x1322e1;
    pvVar10 = (void *)bson_get_data(lVar7);
    apcStack_1b08[0] = (code *)0x1322ec;
    pvVar11 = (void *)bson_get_data(pcVar5);
    apcStack_1b08[0] = (code *)0x1322fb;
    iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(lVar7 + 4));
    if (iVar2 != 0) goto LAB_00132392;
    apcStack_1b08[0] = (code *)0x13230e;
    bson_destroy(pcVar5);
    pcVar23 = pcVar23 + 0x10;
    pcVar8 = pcVar5;
    pcVar19 = __needle;
    if (pcVar23 == (char *)0xb8) {
      lVar7 = 8;
      do {
        apcStack_1b08[0] = (code *)0x132331;
        bson_destroy(*(undefined8 *)((long)apcStack_1a30 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0xb8);
      apcStack_1b08[0] = (code *)0x13234b;
      bson_destroy(uStack_1a70);
      apcStack_1b08[0] = (code *)0x132358;
      bson_destroy(uStack_1a78);
      apcStack_1b08[0] = (code *)0x132365;
      bson_destroy(uStack_1a80);
      apcStack_1b08[0] = (code *)0x13236f;
      bson_destroy(uStack_1a88);
      apcStack_1b08[0] = (code *)0x132379;
      bson_destroy(uStack_1a98);
      apcStack_1b08[0] = (code *)0x132383;
      bson_destroy(uStack_1a90);
      return;
    }
  }
LAB_001324a3:
  apcStack_1b08[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar25 = 8;
  pcStack_1b30 = pcVar8;
  pcStack_1b28 = __needle;
  pcStack_1b20 = pcVar19;
  pcStack_1b18 = pcVar5;
  pcStack_1b10 = (char *)lVar7;
  apcStack_1b08[0] = (code *)&pcStack_1608;
  do {
    pcStack_1e88 = (code *)0x1324f7;
    cVar1 = bson_init_from_json(auStack_1c80,*(undefined8 *)(&UNK_00163268 + lVar25),
                                0xffffffffffffffff,&iStack_1e80);
    if (cVar1 != '\0') {
      pcStack_1e88 = (code *)0x132544;
      test_bson_json_code_errors_cold_3();
LAB_00132544:
      pcStack_1e88 = (code *)0x132549;
      test_bson_json_code_errors_cold_2();
LAB_00132549:
      pcStack_1e88 = (code *)0x132569;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_1e78,
              __needle);
      pcStack_1e88 = (code *)0x13256e;
      abort();
    }
    if (iStack_1e80 != 1) {
      pcStack_1e88 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_1eb0 = &PTR_anon_var_dwarf_1aa32_00163270;
      apcStack_2288[0] = (code *)0x132590;
      pcStack_1ea8 = __needle;
      lStack_1ea0 = lVar25;
      puStack_1e98 = auStack_1c80;
      puStack_1e90 = (undefined1 *)&iStack_1e80;
      pcStack_1e88 = (code *)apcStack_1b08;
      uVar6 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_2288[0] = (code *)0x1325af;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar11 = (void *)0x0;
      pcVar5 = "$ref";
      pcStack_2290 = (char *)0x0;
      pcStack_2298 = "}";
      pcStack_22a0 = oid_zero_oid;
      pcStack_22a8 = (char *)0x6;
      pcStack_22b8 = "$id";
      pcStack_22c0 = "collection";
      pcStack_22c8 = (char *)0x132610;
      pcStack_22b0 = (char *)uVar6;
      pvStack_2248 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_2290 = (char *)0x0;
      pcStack_2298 = "}";
      pcStack_22a0 = (char *)0x1;
      pcStack_22a8 = (char *)0xf;
      pcStack_22b8 = "$id";
      pcStack_22c0 = "collection";
      pcStack_22c8 = (char *)0x132660;
      pcStack_22b0 = (char *)uVar6;
      uStack_2250 = bcon_new(0,"key","{","$ref",uVar6,0);
      apcStack_2288[0] = (code *)0x0;
      pcStack_2290 = "}";
      pcStack_2298 = "}";
      pcStack_22a0 = (char *)0x1;
      pcStack_22a8 = (char *)0xf;
      pcStack_22b8 = "a";
      pcStack_22c0 = "{";
      pcStack_22c8 = "$id";
      pcStack_22d0 = "collection";
      pcStack_22d8 = (char *)0x1326b8;
      pcStack_22b0 = (char *)uVar6;
      pvVar10 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_2290 = (char *)0x0;
      pcStack_2298 = "}";
      pcStack_22a0 = (char *)0x1;
      pcStack_22a8 = (char *)0x7;
      pcStack_22b8 = "meta";
      pcStack_22c0 = (char *)0x1;
      pcStack_22c8 = (char *)0xf;
      pcStack_22d8 = "$id";
      pcStack_22e0 = "collection";
      uStack_22e8 = 0x13271b;
      pcStack_22d0 = (char *)uVar6;
      pcStack_22b0 = (char *)uVar6;
      uStack_2208 = bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_2240 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_2238 = pvStack_2248;
      pcStack_2230 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_2228 = uStack_2250;
      pcStack_2220 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_2218 = pvVar10;
      pcStack_2210 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar19 = "key";
      goto LAB_00132775;
    }
    if (iStack_1e7c != 2) goto LAB_00132544;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1aa32_00163270 + lVar25);
    pcStack_1e88 = (code *)0x13251e;
    pcVar5 = strstr(acStack_1e78,__needle);
    if (pcVar5 == (char *)0x0) goto LAB_00132549;
    lVar25 = lVar25 + 0x10;
    if (lVar25 == 0x98) {
      return;
    }
  } while( true );
  while( true ) {
    if (pcStack_1aa0[uVar20] != __needle[uVar20]) goto LAB_00132488;
    uVar20 = uVar20 + 1;
    if (uStack_197c == (uint)uVar20) break;
LAB_001323c8:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_001323e2:
  uVar4 = uStack_197c;
  if (uStack_197c < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_1b08[0] = (code *)0x132407;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar8,uVar6);
    apcStack_1b08[0] = (code *)0x13241f;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar8 = (char *)(ulong)uVar3;
    apcStack_1b08[0] = (code *)0x132439;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_1aa8 = CONCAT44(uStack_1aa8._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar5 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132494;
    pcVar8 = (char *)(ulong)uStack_197c;
    apcStack_1b08[0] = (code *)0x132460;
    pcVar23 = (char *)write(uVar3,pcVar19,(size_t)pcVar8);
    if (pcVar23 != pcVar8) goto LAB_00132499;
    pcVar8 = (char *)(ulong)*(uint *)(lVar7 + 4);
    apcStack_1b08[0] = (code *)0x132477;
    pcVar23 = (char *)write(uVar4,__needle,(size_t)pcVar8);
    if (pcVar23 != pcVar8) goto LAB_0013249e;
    uVar20 = (ulong)uVar4;
    apcStack_1b08[0] = (code *)0x132488;
    test_bson_json_code_cold_4();
    uVar6 = extraout_RAX;
LAB_00132488:
    uVar20 = uVar20 & 0xffffffff;
  }
  apcStack_1b08[0] = (code *)0x132494;
  test_bson_json_code_cold_6();
LAB_00132494:
  apcStack_1b08[0] = (code *)0x132499;
  test_bson_json_code_cold_5();
LAB_00132499:
  apcStack_1b08[0] = (code *)0x13249e;
  test_bson_json_code_cold_2();
LAB_0013249e:
  apcStack_1b08[0] = (code *)0x1324a3;
  test_bson_json_code_cold_3();
  goto LAB_001324a3;
LAB_00132775:
  apcStack_2288[0] = (code *)0x132791;
  cVar1 = bson_init_from_json(acStack_2200,*(undefined8 *)((long)&pcStack_2240 + (long)pvVar11),
                              0xffffffffffffffff,auStack_2138);
  pcVar8 = acStack_2200;
  pvVar12 = pvVar11;
  if (cVar1 == '\0') goto LAB_0013293d;
  apcStack_2288[0] = (code *)0x1327a4;
  pvStack_2248 = (void *)bson_get_data(acStack_2200);
  pcVar8 = *(char **)((long)&pvStack_2238 + (long)pvVar11);
  apcStack_2288[0] = (code *)0x1327b6;
  pvVar12 = (void *)bson_get_data(pcVar8);
  if (*(uint *)(pcVar8 + 4) != uStack_21fc) {
LAB_0013282b:
    pcVar5 = acStack_2200;
    apcStack_2288[0] = (code *)0x13283d;
    pcVar19 = (char *)bson_as_canonical_extended_json(pcVar5);
    apcStack_2288[0] = (code *)0x13284a;
    uVar6 = bson_as_canonical_extended_json(pcVar8);
    pvVar10 = pvStack_2248;
    uVar3 = *(uint *)(pcVar8 + 4);
    if (uStack_21fc == 0) goto LAB_00132879;
    uVar20 = 0;
    goto LAB_00132860;
  }
  apcStack_2288[0] = (code *)0x1327cd;
  pcVar5 = (char *)bson_get_data(pcVar8);
  apcStack_2288[0] = (code *)0x1327d8;
  pvVar10 = (void *)bson_get_data(acStack_2200);
  apcStack_2288[0] = (code *)0x1327e6;
  iVar2 = bcmp(pcVar5,pvVar10,(ulong)*(uint *)(pcVar8 + 4));
  if (iVar2 != 0) goto LAB_0013282b;
  apcStack_2288[0] = (code *)0x1327f5;
  bson_destroy(acStack_2200);
  pvVar11 = (void *)((long)pvVar11 + 0x10);
  pcVar19 = acStack_2200;
  pvVar10 = pvVar12;
  if (pvVar11 == (void *)0x40) {
    lVar7 = 8;
    do {
      apcStack_2288[0] = (code *)0x132812;
      bson_destroy(*(undefined8 *)((long)&pcStack_2240 + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x48);
    return;
  }
  goto LAB_00132775;
  while( true ) {
    if (*(char *)((long)pvStack_2248 + uVar20) != *(char *)((long)pvVar12 + uVar20))
    goto LAB_00132922;
    uVar20 = uVar20 + 1;
    if (uStack_21fc == (uint)uVar20) break;
LAB_00132860:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_00132879:
  uVar4 = uStack_21fc;
  if (uStack_21fc < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_2288[0] = (code *)0x13289e;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar19,uVar6);
    apcStack_2288[0] = (code *)0x1328b6;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar19 = (char *)(ulong)uVar3;
    apcStack_2288[0] = (code *)0x1328d1;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2250 = CONCAT44(uStack_2250._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar5 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013292e;
    pcVar19 = (char *)(ulong)uStack_21fc;
    apcStack_2288[0] = (code *)0x1328fb;
    pcVar23 = (char *)write(uVar3,pvVar10,(size_t)pcVar19);
    if (pcVar23 != pcVar19) goto LAB_00132933;
    pcVar8 = (char *)(ulong)*(uint *)(pcVar8 + 4);
    apcStack_2288[0] = (code *)0x132911;
    pcVar23 = (char *)write(uVar4,pvVar12,(size_t)pcVar8);
    if (pcVar23 != pcVar8) goto LAB_00132938;
    uVar20 = (ulong)uVar4;
    apcStack_2288[0] = (code *)0x132922;
    test_bson_json_dbref_cold_4();
    uVar6 = extraout_RAX_00;
LAB_00132922:
    uVar20 = uVar20 & 0xffffffff;
  }
  apcStack_2288[0] = (code *)0x13292e;
  test_bson_json_dbref_cold_6();
LAB_0013292e:
  apcStack_2288[0] = (code *)0x132933;
  test_bson_json_dbref_cold_5();
LAB_00132933:
  apcStack_2288[0] = (code *)0x132938;
  test_bson_json_dbref_cold_2();
LAB_00132938:
  apcStack_2288[0] = (code *)0x13293d;
  test_bson_json_dbref_cold_3();
LAB_0013293d:
  apcStack_2288[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  pcStack_2688 = (code *)0x132967;
  pcStack_22b0 = pcVar8;
  pcStack_22a8 = pcVar19;
  pcStack_22a0 = pcVar5;
  pcStack_2298 = (char *)pvVar12;
  pcStack_2290 = (char *)pvVar10;
  apcStack_2288[0] = (code *)&pcStack_1e88;
  uVar6 = bson_bcon_magic();
  pcStack_2688 = (code *)0x132989;
  pvStack_2678 = (void *)bcon_new(0,"euro",uVar6,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_2688 = (code *)0x1329ad;
  pvVar10 = (void *)bcon_new(0,"crlf",uVar6,0,"\r\n",0);
  pcStack_2688 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar6,0,"\"",0);
  pcStack_2688 = (code *)0x1329f1;
  puVar13 = (undefined1 *)bcon_new(0,"backslash",uVar6,0,"\\",0);
  pcStack_2688 = (code *)0x132a0f;
  uVar9 = bcon_new(0,"",uVar6,0,"",0);
  pcStack_2688 = (code *)0x132a31;
  uVar6 = bcon_new(0,"escapes",uVar6,0,"\f\b\t",0);
  pcStack_2688 = (code *)0x132a39;
  uStack_2608 = bson_new();
  pcStack_2670 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_2668 = pvStack_2678;
  pcStack_2660 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_2650 = "{ \"quote\": \"\\\"\"}";
  pcStack_2640 = "{ \"backslash\": \"\\\\\"}";
  pcStack_2630 = "{ \"\": \"\"}";
  pcStack_2620 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_2610 = "{ \"nil\": \"\\u0000\"}";
  pcStack_2688 = (code *)0x132ad6;
  pvStack_2658 = pvVar10;
  puStack_2648 = __n;
  puStack_2638 = puVar13;
  uStack_2628 = uVar9;
  uStack_2618 = uVar6;
  bson_append_utf8(uStack_2608,"nil",0xffffffff,"",1);
  pvVar11 = (void *)0x8;
  while( true ) {
    pcStack_2688 = (code *)0x132b00;
    cVar1 = bson_init_from_json(auStack_2600,*(undefined8 *)((long)&pvStack_2678 + (long)pvVar11),
                                0xffffffffffffffff,auStack_2538);
    puVar15 = auStack_2600;
    pvVar12 = pvVar11;
    if (cVar1 == '\0') break;
    pcStack_2688 = (code *)0x132b13;
    pvStack_2678 = (void *)bson_get_data(auStack_2600);
    puVar15 = *(undefined1 **)((long)&pcStack_2670 + (long)pvVar11);
    pcStack_2688 = (code *)0x132b25;
    pvVar12 = (void *)bson_get_data(puVar15);
    if (*(uint *)(puVar15 + 4) != uStack_25fc) {
LAB_00132b9a:
      puVar13 = auStack_2600;
      pcStack_2688 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar13);
      pcStack_2688 = (code *)0x132bb9;
      uVar6 = bson_as_canonical_extended_json(puVar15);
      pvVar10 = pvStack_2678;
      uVar3 = *(uint *)(puVar15 + 4);
      if (uStack_25fc == 0) goto LAB_00132be8;
      uVar20 = 0;
      goto LAB_00132bcf;
    }
    pcStack_2688 = (code *)0x132b3c;
    puVar13 = (undefined1 *)bson_get_data(puVar15);
    pcStack_2688 = (code *)0x132b47;
    pvVar10 = (void *)bson_get_data(auStack_2600);
    pcStack_2688 = (code *)0x132b55;
    iVar2 = bcmp(puVar13,pvVar10,(ulong)*(uint *)(puVar15 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_2688 = (code *)0x132b64;
    bson_destroy(auStack_2600);
    pvVar11 = (void *)((long)pvVar11 + 0x10);
    __n = auStack_2600;
    pvVar10 = pvVar12;
    if (pvVar11 == (void *)0x78) {
      lVar7 = 8;
      do {
        pcStack_2688 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&pcStack_2670 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x78);
      return;
    }
  }
  goto LAB_00132cac;
  while( true ) {
    if (*(char *)((long)pvStack_2678 + uVar20) != *(char *)((long)pvVar12 + uVar20))
    goto LAB_00132c91;
    uVar20 = uVar20 + 1;
    if (uStack_25fc == (uint)uVar20) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar20) break;
  }
LAB_00132be8:
  uVar4 = uStack_25fc;
  if (uStack_25fc < uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_2688 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__n,uVar6);
    pcStack_2688 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_2688 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_267c = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)uStack_25fc;
    pcStack_2688 = (code *)0x132c6a;
    puVar14 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar14 != __n) goto LAB_00132ca2;
    puVar15 = (undefined1 *)(ulong)*(uint *)(puVar15 + 4);
    pcStack_2688 = (code *)0x132c80;
    puVar14 = (undefined1 *)write(uVar4,pvVar12,(size_t)puVar15);
    if (puVar14 != puVar15) goto LAB_00132ca7;
    uVar20 = (ulong)uVar4;
    pcStack_2688 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar6 = extraout_RAX_01;
LAB_00132c91:
    uVar20 = uVar20 & 0xffffffff;
  }
  pcStack_2688 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_2688 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_2688 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_2688 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
LAB_00132cac:
  pcStack_2688 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_2a88[0] = (code *)0x132cd6;
  puStack_26b0 = puVar15;
  puStack_26a8 = __n;
  puStack_26a0 = puVar13;
  pvStack_2698 = pvVar12;
  pvStack_2690 = pvVar10;
  pcStack_2688 = (code *)apcStack_2288;
  uVar6 = bson_bcon_magic();
  apcStack_2a88[0] = (code *)0x132cf5;
  pcVar5 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar6,0,"euro",0);
  apcStack_2a88[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_2a00,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_2938);
  if (cVar1 == '\0') {
    apcStack_2a88[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_2a88[0] = (code *)0x132d33;
    pvVar10 = (void *)bson_get_data(auStack_2a00);
    apcStack_2a88[0] = (code *)0x132d3e;
    pvVar12 = (void *)bson_get_data(pcVar5);
    if (*(uint *)(pcVar5 + 4) == uStack_29fc) {
      apcStack_2a88[0] = (code *)0x132d53;
      pvVar11 = (void *)bson_get_data(pcVar5);
      apcStack_2a88[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_2a00);
      apcStack_2a88[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar11,__s2,(ulong)*(uint *)(pcVar5 + 4));
      if (iVar2 == 0) {
        apcStack_2a88[0] = (code *)0x132d82;
        bson_destroy(auStack_2a00);
        apcStack_2a88[0] = (code *)0x132d8a;
        bson_destroy(pcVar5);
        return;
      }
    }
    puVar13 = auStack_2a00;
    apcStack_2a88[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar13);
    apcStack_2a88[0] = (code *)0x132db8;
    uVar6 = bson_as_canonical_extended_json(pcVar5);
    uVar3 = *(uint *)(pcVar5 + 4);
    if (uStack_29fc != 0) {
      uVar20 = 0;
      do {
        if (uVar3 == (uint)uVar20) break;
        if (*(char *)((long)pvVar10 + uVar20) != *(char *)((long)pvVar12 + uVar20))
        goto LAB_00132e88;
        uVar20 = uVar20 + 1;
      } while (uStack_29fc != (uint)uVar20);
    }
    uVar4 = uStack_29fc;
    if (uStack_29fc < uVar3) {
      uVar4 = uVar3;
    }
    uVar20 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_2a88[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__n,uVar6);
      apcStack_2a88[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_2a88[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_2a04 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_29fc;
      apcStack_2a88[0] = (code *)0x132e61;
      puVar15 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
      if (puVar15 != __n) goto LAB_00132e9e;
      pcVar5 = (char *)(ulong)*(uint *)(pcVar5 + 4);
      apcStack_2a88[0] = (code *)0x132e77;
      pcVar19 = (char *)write(uVar4,pvVar12,(size_t)pcVar5);
      if (pcVar19 != pcVar5) goto LAB_00132ea3;
      uVar20 = (ulong)uVar4;
      apcStack_2a88[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar6 = extraout_RAX_02;
LAB_00132e88:
      uVar20 = uVar20 & 0xffffffff;
    }
  }
  apcStack_2a88[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_2a88[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_2a88[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_2a88[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_2e08 = (code *)0x132ed6;
  pcStack_2a90 = pcVar5;
  apcStack_2a88[0] = (code *)&pcStack_2688;
  cVar1 = bson_init_from_json(auStack_2e00,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_2d18);
  if (cVar1 == '\0') {
    if (iStack_2d18 != 1) goto LAB_00132f22;
    if (iStack_2d14 != 1) goto LAB_00132f27;
    pcVar5 = acStack_2d10;
    pcStack_2e08 = (code *)0x132f09;
    pcVar19 = strstr(pcVar5,"UESCAPE_TOOSHORT");
    if (pcVar19 != (char *)0x0) {
      pcStack_2e08 = (code *)0x132f16;
      bson_destroy(auStack_2e00);
      return;
    }
  }
  else {
    pcStack_2e08 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_2e08 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_2e08 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_2e08 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_3208 = (code *)0x132f67;
  pcStack_2e10 = pcVar5;
  pcStack_2e08 = (code *)apcStack_2a88;
  cVar1 = bson_init_from_json(acStack_3180,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_3098);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_3208 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_3208 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_3208 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_3208 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_3200,acStack_3180,"x");
    if (cVar1 == '\0') {
      pcStack_3208 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_3208 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_3208 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_3208 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_3208 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_3208 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_3208 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_3208 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_3208 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_3200);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_3208 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_3200);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar5 = acStack_3180;
    pcStack_3208 = (code *)0x132fc2;
    bson_destroy(pcVar5);
    pcStack_3208 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_3098);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_3208 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_3200,acStack_3180,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_3208 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_3200);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_3208 = (code *)0x133020;
    bson_iter_int32(auStack_3200);
  }
  pcStack_3208 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_3208 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_3208 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_3208 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_3208 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_3608 = (code *)0x1331e2;
  pcStack_3218 = pcVar5;
  pvStack_3210 = pvVar12;
  pcStack_3208 = (code *)&pcStack_2e08;
  cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_34a0);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_3608 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_3608 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_3608 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_3608 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_3608 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_3608 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_3608 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_3608 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_3608 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_3608 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_3608 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_3608 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_3608 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_3608 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_3608 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_3608 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') {
      pcStack_3608 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_3608 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_3608 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_3608 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_3608 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_3608 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_3608 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_3608 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_3608 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x12) goto LAB_00133458;
    pvVar12 = (void *)0x7fffffffffffffff;
    pcStack_3608 = (code *)0x13322c;
    lVar7 = bson_iter_int64(auStack_3600);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar5 = acStack_3580;
    pcStack_3608 = (code *)0x133245;
    bson_destroy(pcVar5);
    pcStack_3608 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_34a0);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_3608 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_3600,acStack_3580,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_3608 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_3600);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_3608 = (code *)0x1332a3;
    lVar7 = bson_iter_int64(auStack_3600);
    pvVar12 = (void *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_0013349d;
    pcVar5 = acStack_3580;
    pcStack_3608 = (code *)0x1332bf;
    bson_destroy(pcVar5);
    pcStack_3608 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_34a0);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_34a0 != 1) goto LAB_001334a5;
    if (iStack_349c != 2) goto LAB_001334aa;
    pcVar5 = acStack_3498;
    pcStack_3608 = (code *)0x13331c;
    pcVar19 = strstr(pcVar5,"Number \"9223372036854775808\" is out of range");
    if (pcVar19 == (char *)0x0) goto LAB_001334af;
    pcStack_3608 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_34a0);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_34a0 != 1) goto LAB_001334b7;
    if (iStack_349c != 2) goto LAB_001334bc;
    pcStack_3608 = (code *)0x13337f;
    pcVar19 = strstr(pcVar5,"Number \"-9223372036854775809\" is out of range");
    if (pcVar19 == (char *)0x0) goto LAB_001334c1;
    pcStack_3608 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_34a0);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_34a0 != 1) goto LAB_001334c9;
    if (iStack_349c != 2) goto LAB_001334ce;
    pcStack_3608 = (code *)0x1333e2;
    pcVar19 = strstr(pcVar5,"Number \"10000000000000000000\" is out of range");
    if (pcVar19 == (char *)0x0) goto LAB_001334d3;
    pcStack_3608 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_3580,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_34a0);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_34a0 != 1) goto LAB_001334db;
    if (iStack_349c != 2) goto LAB_001334e0;
    pcStack_3608 = (code *)0x133441;
    pcVar19 = strstr(pcVar5,"Number \"-10000000000000000000\" is out of range");
    if (pcVar19 != (char *)0x0) {
      return;
    }
  }
  pcStack_3608 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_3a08 = (code *)0x133520;
  pcStack_3610 = pcVar5;
  pcStack_3608 = (code *)&pcStack_3208;
  cVar1 = bson_init_from_json(acStack_3980,"{ \"x\": 1 }",0xffffffffffffffff,auStack_3898);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_3a08 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_3a08 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_3a08 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_3a08 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_3a08 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_3a08 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_3a08 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_3a08 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_3a08 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_3a08 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') {
      pcStack_3a08 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_3a08 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_3a08 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_3a08 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_3a08 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_3a08 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_3a08 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_3a08 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_3a08 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_3a08 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_3a08 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_3a08 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_3a08 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_3a00);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar5 = acStack_3980;
    pcStack_3a08 = (code *)0x133579;
    bson_destroy(pcVar5);
    pcStack_3a08 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_3898);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_3a08 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_3a08 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_3a08 = (code *)0x1335d7;
    lVar7 = bson_iter_int64(auStack_3a00);
    if (lVar7 != 0x100000000) goto LAB_001337e7;
    pcVar5 = acStack_3980;
    pcStack_3a08 = (code *)0x1335fa;
    bson_destroy(pcVar5);
    pcStack_3a08 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_3898);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_3a08 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_3a08 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_3a08 = (code *)0x133658;
    dVar29 = (double)bson_iter_double(auStack_3a00);
    if ((dVar29 != 1.0) || (NAN(dVar29))) goto LAB_001337fc;
    pcVar5 = acStack_3980;
    pcStack_3a08 = (code *)0x13367c;
    bson_destroy(pcVar5);
    pcStack_3a08 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_3898);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_3a08 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_3a08 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_3a08 = (code *)0x1336da;
    dVar29 = (double)bson_iter_double(auStack_3a00);
    if ((dVar29 != 0.0) || (NAN(dVar29))) goto LAB_00133811;
    pcVar5 = acStack_3980;
    pcStack_3a08 = (code *)0x1336fe;
    bson_destroy(pcVar5);
    pcStack_3a08 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar5,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_3898);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_3a08 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_3a00,acStack_3980,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_3a08 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_3a00);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_3a08 = (code *)0x133754;
    dVar29 = (double)bson_iter_double(auStack_3a00);
    if ((dVar29 == 0.0) && (!NAN(dVar29))) {
      pcStack_3a08 = (code *)0x133770;
      bson_iter_double(auStack_3a00);
      if (extraout_XMM0_Db < 0) {
        pcStack_3a08 = (code *)0x133787;
        bson_destroy(acStack_3980);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_3a08 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar19 = "2e400";
  ppuVar22 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_3a30 = pcVar5;
  puStack_3a28 = __n;
  puStack_3a20 = puVar13;
  pvStack_3a18 = pvVar12;
  pvStack_3a10 = pvVar10;
  pcStack_3a08 = (code *)&pcStack_3608;
  while( true ) {
    pcStack_3d88 = (code *)0x13386c;
    uVar6 = bson_strdup_printf("{ \"d\" : %s }",pcVar19);
    pcStack_3d88 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_3b80,uVar6,0xffffffffffffffff,&iStack_3d80);
    if (cVar1 != '\0') break;
    if (iStack_3d80 != 1) goto LAB_00133953;
    if (iStack_3d7c != 2) goto LAB_0013394e;
    pcStack_3d88 = (code *)0x1338b7;
    pcVar5 = strstr(acStack_3d78,"out of range");
    if (pcVar5 == (char *)0x0) goto LAB_00133958;
    pcStack_3d88 = (code *)0x1338c8;
    bson_free(uVar6);
    pcStack_3d88 = (code *)0x1338d9;
    uVar6 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar19);
    pcStack_3d88 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_3b80,uVar6,0xffffffffffffffff,&iStack_3d80);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_3d80 != 1) goto LAB_00133967;
    if (iStack_3d7c != 2) goto LAB_00133962;
    pcStack_3d88 = (code *)0x133918;
    pcVar5 = strstr(acStack_3d78,"out of range");
    if (pcVar5 == (char *)0x0) goto LAB_0013396c;
    pcStack_3d88 = (code *)0x133925;
    bson_free(uVar6);
    pcVar19 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
  pcStack_3d88 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_3d88 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_3d88 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_3d88 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_3d88 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_3d88 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_3d88 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_3d88 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_3da0 = "out of range";
  pcVar8 = "{ \"d\": NaN }";
  ppuVar26 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_4100;
  piVar27 = &iStack_4038;
  piVar28 = (int *)0x14c766;
  pcVar5 = (char *)&dStack_4108;
  uStack_3db0 = uVar6;
  puStack_3da8 = (undefined1 *)&iStack_3d80;
  pcStack_3d98 = pcVar19;
  ppuStack_3d90 = ppuVar22;
  pcStack_3d88 = (code *)&pcStack_3a08;
  do {
    apcStack_4188[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar8,0xffffffffffffffff,piVar27);
    if (cVar1 == '\0') {
      apcStack_4188[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_4188[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_4188[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_4188[0] = (code *)0x1339d7;
    uVar6 = bson_bcone_magic();
    apcStack_4188[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar6,1,pcVar5,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_4108) && !NAN(dStack_4108)) goto LAB_00133b30;
    apcStack_4188[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar8 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar19 = "{ \"d\": NaNn }";
  ppuVar26 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_4030;
  piVar27 = aiStack_4100;
  piVar28 = &iStack_4038;
  pcVar5 = "Got parse error at";
  do {
    apcStack_4188[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar27,pcVar19,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_4038 != 1) goto LAB_00133b4c;
    if (iStack_4034 != 1) goto LAB_00133b3f;
    apcStack_4188[0] = (code *)0x133a91;
    pcVar19 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar19 == (char *)0x0) goto LAB_00133b44;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar19 = "{ \"d\": nu";
  ppuVar26 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar27 = aiStack_4100;
  piVar28 = &iStack_4038;
  pcVar5 = "Incomplete JSON";
  while( true ) {
    apcStack_4188[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar27,pcVar19,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') break;
    if (iStack_4038 != 1) goto LAB_00133b5e;
    if (iStack_4034 != 1) goto LAB_00133b51;
    apcStack_4188[0] = (code *)0x133b05;
    pcVar19 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar19 == (char *)0x0) goto LAB_00133b56;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_4188[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_4188[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_4188[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_4188[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_4188[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_4188[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_4188[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar19 = "{ \"d\": Infinity }";
  ppuVar22 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_41b0 = __haystack;
  pdStack_41a8 = (double *)pcVar5;
  ppuStack_41a0 = ppuVar26;
  piStack_4198 = piVar27;
  piStack_4190 = piVar28;
  apcStack_4188[0] = (code *)&pcStack_3d88;
  do {
    apcStack_4588[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_4500,pcVar19,0xffffffffffffffff,&iStack_4438);
    if (cVar1 == '\0') {
      apcStack_4588[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_4588[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_4588[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_4588[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_4588[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_4500,"d",__haystack,1,&puStack_4508,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_4508)) ||
       (!NAN((double)puStack_4508 - (double)puStack_4508) &&
        !NAN((double)puStack_4508 - (double)puStack_4508))) goto LAB_00133dda;
    apcStack_4588[0] = (code *)0x133c0d;
    bson_destroy(auStack_4500);
    pcVar19 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar5 = "{ \"d\": -Infinity }";
  ppuVar22 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_4588[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_4500,pcVar5,0xffffffffffffffff,&iStack_4438);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_4588[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_4500,"d",__haystack,1,&puStack_4508,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_4508)) || (!NAN((double)puStack_4508 - (double)puStack_4508)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_4508) goto LAB_00133dee;
    apcStack_4588[0] = (code *)0x133cb5;
    bson_destroy(auStack_4500);
    pcVar5 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
  } while (pcVar5 != (char *)0x0);
  pcVar19 = "{ \"d\": Infinityy }";
  ppuVar26 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_4430;
  ppuVar22 = (undefined **)&iStack_4438;
  pcVar5 = "Got parse error at";
  do {
    apcStack_4588[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_4500,pcVar19,0xffffffffffffffff,ppuVar22);
    if (cVar1 != '\0') goto LAB_00133df3;
    if (iStack_4438 != 1) goto LAB_00133e0a;
    if (iStack_4434 != 1) goto LAB_00133dfd;
    apcStack_4588[0] = (code *)0x133d37;
    pcVar19 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar19 == (char *)0x0) goto LAB_00133e02;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar19 = "{ \"d\": In";
  ppuVar26 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar22 = (undefined **)&iStack_4438;
  pcVar5 = "Incomplete JSON";
  while( true ) {
    apcStack_4588[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_4500,pcVar19,0xffffffffffffffff,ppuVar22);
    if (cVar1 != '\0') break;
    if (iStack_4438 != 1) goto LAB_00133e1c;
    if (iStack_4434 != 1) goto LAB_00133e0f;
    apcStack_4588[0] = (code *)0x133daf;
    pcVar19 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar19 == (char *)0x0) goto LAB_00133e14;
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_4588[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_4588[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_4588[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_4588[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_4588[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_4588[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar13 = auStack_4500;
  apcStack_4588[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_4908 = (code *)0x133e4e;
  apcStack_4588[0] = (code *)apcStack_4188;
  cVar1 = bson_init_from_json(auStack_4900,"{ \"x\": null }",0xffffffffffffffff,auStack_4810);
  if (cVar1 == '\0') {
    pcStack_4908 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_4908 = (code *)0x133e57;
    uVar6 = bson_bcone_magic();
    pcStack_4908 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_4900,"x",uVar6,9,0);
    if (cVar1 != '\0') {
      pcStack_4908 = (code *)0x133e7f;
      bson_destroy(auStack_4900);
      return;
    }
  }
  pcStack_4908 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_4d08 = (code *)0x0;
  pcStack_4d10 = "}";
  acStack_4d20[8] = -0x2e;
  acStack_4d20[9] = '>';
  acStack_4d20[10] = '\x13';
  acStack_4d20[0xb] = '\0';
  acStack_4d20[0xc] = '\0';
  acStack_4d20[0xd] = '\0';
  acStack_4d20[0xe] = '\0';
  acStack_4d20[0xf] = '\0';
  piStack_4930 = __haystack;
  pcStack_4928 = pcVar5;
  ppuStack_4920 = ppuVar26;
  puStack_4918 = puVar13;
  ppuStack_4910 = ppuVar22;
  pcStack_4908 = (code *)apcStack_4588;
  uVar20 = bcon_new(0,"a","{","b","{");
  uStack_4c10 = 0;
  uStack_4c08 = 0;
  uStack_4c20 = 0;
  uStack_4c18 = 0;
  uStack_4c30 = 0;
  uStack_4c28 = 0;
  uStack_4c40 = 0;
  uStack_4c38 = 0;
  uStack_4c50 = 0;
  uStack_4c48 = 0;
  uStack_4c60 = 0;
  uStack_4c58 = 0;
  uStack_4c70 = 0;
  uStack_4c68 = 0;
  uStack_4c80 = (undefined *)0x500000003;
  uStack_4c78 = 5;
  pcStack_4d08 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_4c80,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_4bb8);
  if (cVar1 != '\0') {
    pcStack_4d08 = (code *)0x133f47;
    ppuVar22 = (undefined **)bson_get_data(&uStack_4c80);
    pcStack_4d08 = (code *)0x133f52;
    puVar13 = (undefined1 *)bson_get_data(uVar20);
    if (*(int *)(uVar20 + 4) == uStack_4c80._4_4_) {
      pcStack_4d08 = (code *)0x133f67;
      pvVar10 = (void *)bson_get_data(uVar20);
      pcStack_4d08 = (code *)0x133f77;
      pvVar11 = (void *)bson_get_data(&uStack_4c80);
      pcStack_4d08 = (code *)0x133f85;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar20 + 4));
      if (iVar2 == 0) {
        pcStack_4d08 = (code *)0x133f96;
        bson_destroy(&uStack_4c80);
        pcStack_4d08 = (code *)0x133f9e;
        bson_destroy(uVar20);
        return;
      }
    }
    ppuVar26 = (undefined **)&uStack_4c80;
    pcStack_4d08 = (code *)0x133fbf;
    pcVar5 = (char *)bson_as_canonical_extended_json(ppuVar26);
    pcStack_4d08 = (code *)0x133fcc;
    uVar6 = bson_as_canonical_extended_json(uVar20);
    uVar3 = *(uint *)(uVar20 + 4);
    if (uStack_4c80._4_4_ != 0) {
      uVar21 = 0;
      do {
        if (uVar3 == (uint)uVar21) break;
        if (*(char *)((long)ppuVar22 + uVar21) != puVar13[uVar21]) goto LAB_0013409c;
        uVar21 = uVar21 + 1;
      } while (uStack_4c80._4_4_ != (uint)uVar21);
    }
    uVar4 = uStack_4c80._4_4_;
    if (uStack_4c80._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar21 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_4d08 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,pcVar5,uVar6);
      pcStack_4d08 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar5 = (char *)(ulong)uVar3;
      pcStack_4d08 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_4c84 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar26 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar5 = (char *)((ulong)uStack_4c80 >> 0x20);
      pcStack_4d08 = (code *)0x134075;
      pcVar19 = (char *)write(uVar3,ppuVar22,(size_t)pcVar5);
      if (pcVar19 != pcVar5) goto LAB_001340ad;
      uVar20 = (ulong)*(uint *)(uVar20 + 4);
      pcStack_4d08 = (code *)0x13408b;
      uVar21 = write(uVar4,puVar13,uVar20);
      if (uVar21 != uVar20) goto LAB_001340b2;
      uVar21 = (ulong)uVar4;
      pcStack_4d08 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar6 = extraout_RAX_03;
LAB_0013409c:
      uVar21 = uVar21 & 0xffffffff;
    }
    pcStack_4d08 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_4d08 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_4d08 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_4d08 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_4d08 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar19 = acStack_4d20;
  acStack_4d20[8] = '\0';
  acStack_4d20[9] = '\0';
  acStack_4d20[10] = '\0';
  acStack_4d20[0xb] = '\0';
  acStack_4d20[0xc] = '\0';
  acStack_4d20[0xd] = '\0';
  acStack_4d20[0xe] = '@';
  acStack_4d20[0xf] = '0';
  acStack_4d20[0] = '\v';
  acStack_4d20[1] = '\0';
  acStack_4d20[2] = '\0';
  acStack_4d20[3] = '\0';
  acStack_4d20[4] = '\0';
  acStack_4d20[5] = '\0';
  acStack_4d20[6] = '\0';
  acStack_4d20[7] = '\0';
  pcStack_4d30 = (code *)0x1340ea;
  pcStack_4d10 = (char *)uVar20;
  pcStack_4d08 = (code *)puVar13;
  plVar16 = (long *)bson_new();
  pcStack_4d30 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar16,"decimal128",0xffffffff,pcVar19);
  if (cVar1 == '\0') {
    pcStack_4d30 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_4d30 = (code *)0x134113;
    pcVar19 = (char *)bson_as_json(plVar16,auStack_4d28);
    if (pcVar19 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_4d30 = (code *)0x13413d;
      bson_free(pcVar19);
      pcStack_4d30 = (code *)0x134145;
      bson_destroy(plVar16);
      return;
    }
    pcStack_4d30 = (code *)0x134131;
    iVar2 = strcmp(pcVar19,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_4d30 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar30 = &pcStack_4d30;
  ppuStack_5188 = (undefined **)0x13418d;
  plStack_4d38 = plVar16;
  pcStack_4d30 = (code *)&pcStack_4908;
  cVar1 = bson_init_from_json(auStack_5080,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_4f98);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_5188 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_5100,auStack_5080);
  if (cVar1 == '\0') {
    ppuStack_5188 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_5188 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_5188 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_5188 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_5188 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_5100,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_5188 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_5100);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar16 = &lStack_5110;
    ppuStack_5188 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_5100,plVar16);
    if (lStack_5110 != 0xb) goto LAB_00134227;
    if (lStack_5108 == 0x3040000000000000) {
      ppuStack_5188 = (undefined **)0x134211;
      bson_destroy(auStack_5080);
      return;
    }
  }
  ppuStack_5188 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_5188 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar8 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar24 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_51a0 = plVar16;
  pcStack_5198 = pcVar5;
  pcStack_5190 = pcVar19;
  ppuStack_5188 = ppuVar22;
  do {
    pcStack_53b0 = (code *)0x134273;
    lVar7 = bson_new_from_json(pcVar8,0xffffffffffffffff,&iStack_53a0);
    if (lVar7 != 0) {
      pcStack_53b0 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_53b0 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_5398,
              ppuVar22);
      pcStack_53b0 = (code *)0x1342e3;
      abort();
    }
    if (iStack_53a0 != 1) {
LAB_001342e8:
      pcStack_53b0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_55c8 = (code *)0x13430d;
      pcStack_53b8 = acStack_5398;
      pcStack_53b0 = (code *)&iStack_53a0;
      pcVar5 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_55b8);
      pcStack_55c8 = (code *)0x13431a;
      pcVar19 = (char *)bson_as_json(pcVar5,0);
      if (pcVar19 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_55c8 = (code *)0x134344;
        bson_free(pcVar19);
        pcStack_55c8 = (code *)0x13434c;
        bson_destroy(pcVar5);
        return;
      }
      pcStack_55c8 = (code *)0x134338;
      iVar2 = strcmp(pcVar19,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_55c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_57d8 = 0x2200223a2261227b;
      uStack_57d0 = 0x7d;
      uStack_57dc = 0x227b;
      pcStack_55c8 = (code *)pcVar5;
      lVar7 = bson_new_from_json(&uStack_57d8,9,&iStack_57c8);
      if (lVar7 == 0) {
        if (iStack_57c8 != 1) goto LAB_00134418;
        if (iStack_57c4 != 1) goto LAB_0013441d;
        pcVar5 = acStack_57c0;
        pcVar8 = strstr(pcVar5,"Got parse error");
        if (pcVar8 == (char *)0x0) goto LAB_00134422;
        lVar7 = bson_new_from_json(&uStack_57dc,3,&iStack_57c8);
        if (lVar7 != 0) goto LAB_00134413;
        if (iStack_57c8 != 1) goto LAB_0013442a;
        if (iStack_57c4 == 1) {
          pcVar8 = strstr(pcVar5,"Got parse error");
          if (pcVar8 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar6 = extraout_RAX_04;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0,uVar6,pcVar5,ppuVar24,ppuVar26,pcVar19,ppuVar22,ppcVar30)
      ;
      uVar17 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar6,uVar17,0);
      uVar6 = bson_new();
      uVar17 = bson_new();
      uVar18 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar6,uVar17,uVar18,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar6,0);
      uVar6 = bson_new();
      _test_json_produces_multiple("[]",0,uVar6,0);
      uVar6 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar6,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_539c != 2) {
      pcStack_53b0 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar22 = (undefined **)ppuVar24[-1];
    pcStack_53b0 = (code *)0x13429a;
    pcVar5 = strstr(acStack_5398,(char *)ppuVar22);
    if (pcVar5 == (char *)0x0) goto LAB_001342c0;
    pcVar8 = *ppuVar24;
    ppuVar24 = ppuVar24 + 2;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_4188[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_4588[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_4588[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_4588[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar26 = &puStack_4508;
  pcVar5 = "d";
  apcStack_4588[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_4588[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_read_binary (void)
{
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   r = bson_init_from_json (
      &b,
      "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}",
      -1,
      &error);
   ASSERT_OR_PRINT (r, error);

   BCON_EXTRACT (&b, "b", BCONE_BIN (subtype, binary, len));
   ASSERT_CMPINT ((int) subtype, ==, 5);
   ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
   ASSERT_CMPSTR ((const char *) binary, "foo");

   bson_destroy (&b);

   r = bson_init_from_json (
      &b,
      "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}",
      -1,
      &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "b", BCONE_BIN (subtype, binary, len));
   ASSERT_CMPINT ((int) subtype, ==, 5);
   ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
   ASSERT_CMPSTR ((const char *) binary, "foo");

   bson_destroy (&b);

   /* no base64 */
   r = bson_init_from_json (
      &b, "{\"b\": {\"$binary\": {\"subType\": \"5\"}}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"base64\" after \"subType\"");

   /* no subType */
   r = bson_init_from_json (
      &b, "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"subType\" after \"base64\"");
}